

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriParse.c
# Opt level: O0

wchar_t uriParseSingleUriExMmA
                  (UriUriA *uri,char *first,char *afterLast,char **errorPos,UriMemoryManager *memory
                  )

{
  UriBool UVar1;
  undefined1 auStack_58 [4];
  wchar_t res;
  UriParserStateA_conflict state;
  UriMemoryManager *memory_local;
  char **errorPos_local;
  char *afterLast_local;
  char *first_local;
  UriUriA *uri_local;
  
  if (((uri == (UriUriA *)0x0) || (first == (char *)0x0)) || (afterLast == (char *)0x0)) {
    uri_local._4_4_ = L'\x02';
  }
  else {
    if (memory == (UriMemoryManager *)0x0) {
      state.reserved = &defaultMemoryManager;
    }
    else {
      state.reserved = memory;
      UVar1 = uriMemoryManagerIsComplete(memory);
      if (UVar1 != 1) {
        return L'\n';
      }
    }
    _auStack_58 = uri;
    uri_local._4_4_ =
         uriParseUriExMmA((UriParserStateA_conflict *)auStack_58,first,afterLast,
                          (UriMemoryManager *)state.reserved);
    if (uri_local._4_4_ != L'\0') {
      if (errorPos != (char **)0x0) {
        *errorPos = (char *)state._8_8_;
      }
      uriFreeUriMembersMmA(uri,(UriMemoryManager *)state.reserved);
    }
  }
  return uri_local._4_4_;
}

Assistant:

int URI_FUNC(ParseSingleUriExMm)(URI_TYPE(Uri) * uri,
		const URI_CHAR * first, const URI_CHAR * afterLast,
		const URI_CHAR ** errorPos, UriMemoryManager * memory) {
	URI_TYPE(ParserState) state;
	int res;

	/* Check params */
	if ((uri == NULL) || (first == NULL) || (afterLast == NULL)) {
		return URI_ERROR_NULL;
	}
	URI_CHECK_MEMORY_MANAGER(memory);  /* may return */

	state.uri = uri;

	res = URI_FUNC(ParseUriExMm)(&state, first, afterLast, memory);

	if (res != URI_SUCCESS) {
		if (errorPos != NULL) {
			*errorPos = state.errorPos;
		}
		URI_FUNC(FreeUriMembersMm)(uri, memory);
	}

	return res;
}